

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocess.cpp
# Opt level: O3

void __thiscall tsbp::PreprocessPacking2D::Run(PreprocessPacking2D *this)

{
  pointer pRVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  PreprocessPacking2D *this_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> newItems;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  pointer pRStack_20;
  pointer local_18;
  
  auVar2 = _DAT_00139900;
  pRVar1 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 5;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar6 = lVar5 + -1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    piVar4 = &pRVar1[1].InternId;
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_00139900;
    auVar11 = _DAT_001398f0;
    do {
      auVar10 = auVar11 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        piVar4[-8] = (int)uVar7;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        *piVar4 = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar6 + 2;
      piVar4 = piVar4 + 0x10;
    } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar7);
  }
  this_00 = (PreprocessPacking2D *)&stack0xffffffffffffffb0;
  std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::vector
            ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&stack0xffffffffffffffb0,
             &this->items);
  local_38 = (this->container).super_Rectangle.X;
  iStack_34 = (this->container).super_Rectangle.Y;
  iStack_30 = (this->container).super_Rectangle.Dx;
  iStack_2c = (this->container).super_Rectangle.Dy;
  local_28 = (this->container).super_Rectangle.InternId;
  iStack_24 = (this->container).super_Rectangle.ExternId;
  pRStack_20 = (pointer)(this->container).super_Rectangle.Area;
  RemoveLargeItems(this_00,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                           &stack0xffffffffffffffb0,(Bin *)&stack0xffffffffffffffc8);
  FilterFrameConfigurations
            (this_00,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                     &stack0xffffffffffffffb0,(Bin *)&stack0xffffffffffffffc8);
  pRStack_20 = (pointer)(double)(iStack_2c * iStack_30);
  local_38 = 0;
  iStack_34 = 0;
  local_28 = -1;
  iStack_24 = -1;
  local_18 = pRStack_20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Preprocess removed ",0x13);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," items ",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"and reduced container area by ",0x1e);
  poVar3 = std::ostream::_M_insert<double>
                     ((this->container).super_Rectangle.Area - (double)local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
  auVar2 = _DAT_00139900;
  if ((long)local_48 - (long)local_50 != 0) {
    lVar5 = (long)local_48 - (long)local_50 >> 5;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar6 = lVar5 + -1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    piVar4 = &local_50[1].InternId;
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00139900;
    auVar10 = _DAT_001398f0;
    do {
      auVar11 = auVar10 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        piVar4[-8] = (int)uVar7;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *piVar4 = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar6 + 2;
      piVar4 = piVar4 + 0x10;
    } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar7);
  }
  (this->PreprocessedContainer).super_Rectangle.InternId = local_28;
  (this->PreprocessedContainer).super_Rectangle.ExternId = iStack_24;
  (this->PreprocessedContainer).super_Rectangle.Area = (double)pRStack_20;
  (this->PreprocessedContainer).super_Rectangle.X = local_38;
  (this->PreprocessedContainer).super_Rectangle.Y = iStack_34;
  (this->PreprocessedContainer).super_Rectangle.Dx = iStack_30;
  (this->PreprocessedContainer).super_Rectangle.Dy = iStack_2c;
  std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator=
            (&this->ProcessedItems,
             (vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&stack0xffffffffffffffb0);
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50,(long)local_40 - (long)local_50);
  }
  return;
}

Assistant:

void PreprocessPacking2D::Run()
{
    InitializeInternIds(this->items);

    std::vector<Rectangle> newItems = this->items;
    Bin newContainer = this->container;

    RemoveLargeItems(newItems, newContainer);
    FilterFrameConfigurations(newItems, newContainer);
    ////EnlargeItemsByOrthogonalPacking(newItems, newContainer);

    // Reconstruct to correctly initialize area and volume.
    newContainer = Bin(0, 0, newContainer.Dx, newContainer.Dy, -1, -1);

    std::cout << "Preprocess removed " << this->items.size() - newItems.size() << " items "
              << "and reduced container area by " << this->container.Area - newContainer.Area << ".\n";

    InitializeInternIds(newItems);

    PreprocessedContainer = newContainer;
    ProcessedItems = newItems;
}